

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O2

unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
 __thiscall duckdb::StreamQueryResult::Materialize(StreamQueryResult *this)

{
  Allocator *args;
  pointer pCVar1;
  pointer pDVar2;
  type input;
  pointer *__ptr;
  long *in_RSI;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  templated_unique_single_t collection;
  ColumnDataAppendState append_state;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_98;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  local_90;
  ColumnDataAppendState local_88;
  
  if (((char)in_RSI[0x19] == '\x01') && (in_RSI[0x31] != 0)) {
    args = Allocator::DefaultAllocator();
    make_uniq<duckdb::ColumnDataCollection,duckdb::Allocator&,duckdb::vector<duckdb::LogicalType,true>&>
              ((duckdb *)&local_90,args,(vector<duckdb::LogicalType,_true> *)(in_RSI + 0x13));
    local_88.current_chunk_state.handles._M_h._M_buckets =
         &local_88.current_chunk_state.handles._M_h._M_single_bucket;
    local_88.current_chunk_state.handles._M_h._M_bucket_count = 1;
    local_88.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_88.current_chunk_state.handles._M_h._M_element_count = 0;
    local_88.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_88.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
    local_88.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_88.current_chunk_state.properties = INVALID;
    local_88.vector_data.
    super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.vector_data.
    super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.vector_data.
    super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                           *)&local_90);
    ColumnDataCollection::InitializeAppend(pCVar1,&local_88);
    while( true ) {
      (**(code **)(*in_RSI + 0x10))(&local_98);
      if (local_98._M_head_impl == (DataChunk *)0x0) break;
      pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&local_98);
      if (pDVar2->count == 0) break;
      pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                             *)&local_90);
      input = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                        ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                          *)&local_98);
      ColumnDataCollection::Append(pCVar1,&local_88,input);
      ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_98
                );
    }
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_98);
    make_uniq<duckdb::MaterializedQueryResult,duckdb::StatementType&,duckdb::StatementProperties&,duckdb::vector<std::__cxx11::string,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::ClientProperties&>
              ((duckdb *)&local_98,(StatementType *)((long)in_RSI + 9),
               (StatementProperties *)(in_RSI + 2),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(in_RSI + 0x16),
               (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)&local_90,(ClientProperties *)(in_RSI + 0x2a));
    if ((char)in_RSI[0x19] == '\0') {
      make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData&>
                ((duckdb *)this,(ErrorData *)(in_RSI + 0x1a));
      if (local_98._M_head_impl != (DataChunk *)0x0) {
        (**(code **)&(((local_98._M_head_impl)->data).
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start)->type)();
      }
    }
    else {
      (this->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult =
           (_func_int **)local_98._M_head_impl;
    }
    ColumnDataAppendState::~ColumnDataAppendState(&local_88);
    ::std::
    unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
    ~unique_ptr(&local_90);
  }
  else {
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData&>
              ((duckdb *)this,(ErrorData *)(in_RSI + 0x1a));
  }
  return (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
          )(unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
            )this;
}

Assistant:

unique_ptr<MaterializedQueryResult> StreamQueryResult::Materialize() {
	if (HasError() || !context) {
		return make_uniq<MaterializedQueryResult>(GetErrorObject());
	}
	auto collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);

	ColumnDataAppendState append_state;
	collection->InitializeAppend(append_state);
	while (true) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
		auto chunk = AlternativeFetch(*this);
#else
		auto chunk = Fetch();
#endif
		if (!chunk || chunk->size() == 0) {
			break;
		}
		collection->Append(append_state, *chunk);
	}
	auto result =
	    make_uniq<MaterializedQueryResult>(statement_type, properties, names, std::move(collection), client_properties);
	if (HasError()) {
		return make_uniq<MaterializedQueryResult>(GetErrorObject());
	}
	return result;
}